

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_parser.cpp
# Opt level: O3

bool __thiscall duckdb::SQLLogicParser::OpenFile(SQLLogicParser *this,string *path)

{
  char cVar1;
  long lVar2;
  istream *piVar3;
  char *__end;
  bool bVar4;
  string line;
  ifstream infile;
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::__cxx11::string::_M_assign((string *)this);
  std::ifstream::ifstream(local_238,(string *)this,_S_in);
  lVar2 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar2] & 5) == 0) {
    local_2d8 = local_2c8;
    local_2d0 = 0;
    local_2c8[0] = 0;
    while( true ) {
      cVar1 = std::ios::widen((char)&local_2d8 + (char)lVar2 + -0x60);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2d8,cVar1);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      local_278[0] = local_268;
      std::__cxx11::string::_M_construct<char*>((string *)local_278,local_2d8,local_2d8 + local_2d0)
      ;
      local_298[0] = local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"\r","");
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,anon_var_dwarf_d0a3e5 + 9,anon_var_dwarf_d0a3e5 + 9);
      duckdb::StringUtil::Replace
                (&local_258,(string *)local_278,(string *)local_298,(string *)local_2b8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->lines,
                 &local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      if (local_2b8[0] != local_2a8) {
        operator_delete(local_2b8[0]);
      }
      if (local_298[0] != local_288) {
        operator_delete(local_298[0]);
      }
      if (local_278[0] != local_268) {
        operator_delete(local_278[0]);
      }
      lVar2 = *(long *)(local_238[0] + -0x18);
    }
    bVar4 = (abStack_218[*(long *)(local_238[0] + -0x18)] & 1) == 0;
    if (local_2d8 != local_2c8) {
      operator_delete(local_2d8);
    }
  }
  else {
    bVar4 = false;
  }
  std::ifstream::~ifstream(local_238);
  return bVar4;
}

Assistant:

bool SQLLogicParser::OpenFile(const string &path) {
	this->file_name = path;

	std::ifstream infile(file_name);
	if (infile.bad() || infile.fail()) {
		return false;
	}

	string line;
	while (std::getline(infile, line)) {
		lines.push_back(StringUtil::Replace(line, "\r", ""));
	}
	return !infile.bad();
}